

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O2

void zzAddWMod_fast(word *b,word *a,word w,word *mod,size_t n)

{
  int iVar1;
  word wVar2;
  
  wVar2 = zzAddW(b,a,n,w);
  if (wVar2 == 0) {
    iVar1 = wwCmp(b,mod,n);
    if (iVar1 < 1) {
      return;
    }
  }
  zzSub2(b,mod,n);
  return;
}

Assistant:

void FAST(zzAddWMod)(word b[], const word a[], register word w, 
	const word mod[], size_t n)
{
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(b, mod, n));
	ASSERT(wwCmp(a, mod, n) < 0 && wwCmpW(mod, n, w) > 0);
	// a + w >= mod => a + w - mod < mod
	if (zzAddW(b, a, n, w) || wwCmp(b, mod, n) > 0)
		zzSub2(b, mod, n);
	w = 0;
}